

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

bool __thiscall Cleaner::FileExists(Cleaner *this,string *path)

{
  int iVar1;
  int extraout_var;
  string err;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  iVar1 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                    (this->disk_interface_,path,&local_30);
  if (CONCAT44(extraout_var,iVar1) == -1) {
    Error("%s",local_30);
  }
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return CONCAT44(extraout_var,iVar1) != 0 && -1 < extraout_var;
}

Assistant:

void Cleaner::DoCleanRule(const Rule* rule) {
  assert(rule);

  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    if ((*e)->rule().name() == rule->name()) {
      for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
           out_node != (*e)->outputs_.end(); ++out_node) {
        Remove((*out_node)->path());
        RemoveEdgeFiles(*e);
      }
    }
  }
}